

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_psg.cpp
# Opt level: O0

void __thiscall PSG::MakeNoiseTable(PSG *this)

{
  int local_20;
  uint local_1c;
  int j;
  int n;
  int i;
  int noise;
  PSG *this_local;
  
  if (noisetable[0] == 0) {
    n = 0x37f1;
    for (j = 0; j < 0x800; j = j + 1) {
      local_1c = 0;
      for (local_20 = 0; local_20 < 0x20; local_20 = local_20 + 1) {
        local_1c = local_1c * 2 + (n & 1U);
        n = n >> 1 | (n << 0xe ^ n << 0x10) & 0x10000U;
      }
      noisetable[j] = local_1c;
    }
  }
  return;
}

Assistant:

void PSG::MakeNoiseTable()
{
	if (!noisetable[0])
	{
		int noise = 14321;
		for (int i=0; i<noisetablesize; i++)
		{
			int n = 0;
			for (int j=0; j<32; j++)
			{
				n = n * 2 + (noise & 1);
				noise = (noise >> 1) | (((noise << 14) ^ (noise << 16)) & 0x10000);
			}
			noisetable[i] = n;
		}
	}
}